

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation.h
# Opt level: O0

bilingual_str * tinyformat::format<char[13]>(bilingual_str *fmt,char (*args) [13])

{
  bilingual_str *in_RDI;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 translate_arg;
  undefined1 in_stack_ffffffffffffff7f;
  char (*in_stack_ffffffffffffff80) [13];
  bilingual_str *args_00;
  string *fmt_00;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = 0;
  fmt_00 = (string *)&stack0xfffffffffffffff7;
  args_00 = in_RDI;
  format<char[13]>(bilingual_str_const&,char_const(&)[13])::{lambda(auto:1_const&,bool)#1}::
  operator()((anon_class_1_0_00000001 *)in_RDI,in_stack_ffffffffffffff80,
             (bool)in_stack_ffffffffffffff7f);
  format<char[13]>(fmt_00,(char (*) [13])args_00);
  format<char[13]>(bilingual_str_const&,char_const(&)[13])::{lambda(auto:1_const&,bool)#1}::
  operator()((anon_class_1_0_00000001 *)in_RDI,in_stack_ffffffffffffff80,
             (bool)in_stack_ffffffffffffff7f);
  format<char[13]>(fmt_00,(char (*) [13])args_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str format(const bilingual_str& fmt, const Args&... args)
{
    const auto translate_arg{[](const auto& arg, bool translated) -> const auto& {
        if constexpr (std::is_same_v<decltype(arg), const bilingual_str&>) {
            return translated ? arg.translated : arg.original;
        } else {
            return arg;
        }
    }};
    return bilingual_str{tfm::format(fmt.original, translate_arg(args, false)...),
                         tfm::format(fmt.translated, translate_arg(args, true)...)};
}